

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O3

void __thiscall QMenuPrivate::~QMenuPrivate(QMenuPrivate *this)

{
  QMenuScroller *pQVar1;
  QObject *pQVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QMenuPrivate_007f7290;
  pQVar1 = this->scroll;
  if ((pQVar1 != (QMenuScroller *)0x0) && ((pQVar1->scrollTimer).m_id != Invalid)) {
    QBasicTimer::stop();
  }
  operator_delete(pQVar1,0xc);
  pDVar5 = (this->platformMenu).wp.d;
  if (pDVar5 != (Data *)0x0) {
    pQVar2 = (this->platformMenu).wp.value;
    if (((pQVar2 != (QObject *)0x0 && *(int *)(pDVar5 + 4) != 0) &&
        (*(long *)(*(long *)(pQVar2 + 8) + 0x10) == 0)) && (*(int *)(pDVar5 + 4) != 0)) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
  }
  pDVar5 = (this->popupScreen).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->popupScreen).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->noReplayFor).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->noReplayFor).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->actionAboutToTrigger).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->actionAboutToTrigger).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->platformMenu).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->platformMenu).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->defaultAction).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->defaultAction).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  QMenuSloppyState::~QMenuSloppyState(&this->sloppyState);
  pDVar5 = (this->tornPopup).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->tornPopup).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->causedPopup).action.wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->causedPopup).action.wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->causedPopup).widget.wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->causedPopup).widget.wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  pDVar5 = (this->activeMenu).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->activeMenu).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  if ((this->searchBufferTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  pDVar3 = (this->searchBuffer).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->searchBuffer).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar5 = (this->syncAction).wp.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      pDVar5 = (this->syncAction).wp.d;
      if (pDVar5 == (Data *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      operator_delete(pDVar5);
    }
  }
  if ((this->delayState).timer.m_id != Invalid) {
    QBasicTimer::stop();
  }
  QHash<QAction_*,_QWidget_*>::~QHash(&this->widgetItems);
  pDVar4 = (this->actionRects).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->actionRects).d.d)->super_QArrayData,0x10,0x10);
    }
  }
  QWidgetPrivate::~QWidgetPrivate(&this->super_QWidgetPrivate);
  return;
}

Assistant:

~QMenuPrivate()
    {
        delete scroll;
        if (!platformMenu.isNull() && !platformMenu->parent())
            delete platformMenu.data();
    }